

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void sf::priv::GlContext::releaseTransientContext(void)

{
  TransientContext *this;
  TransientContext *pTVar1;
  Lock lock;
  TransientContext *in_stack_ffffffffffffffc8;
  TransientContext *in_stack_ffffffffffffffd0;
  Mutex *in_stack_ffffffffffffffd8;
  Lock *in_stack_ffffffffffffffe0;
  
  Lock::Lock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this = ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext>::operator->
                   ((ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext> *)
                    0x2f4531);
  this->referenceCount = this->referenceCount - 1;
  pTVar1 = ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext>::operator->
                     ((ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext> *)
                      0x2f454f);
  if (pTVar1->referenceCount == 0) {
    in_stack_ffffffffffffffd0 =
         ThreadLocalPtr::operator_cast_to_TransientContext_
                   ((ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext> *)
                    0x2f456c);
    if (in_stack_ffffffffffffffd0 != (TransientContext *)0x0) {
      anon_unknown.dwarf_24fcec::GlContextImpl::TransientContext::~TransientContext(this);
      operator_delete(in_stack_ffffffffffffffd0);
    }
    ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext>::operator=
              ((ThreadLocalPtr<(anonymous_namespace)::GlContextImpl::TransientContext> *)
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  Lock::~Lock((Lock *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void GlContext::releaseTransientContext()
{
    using GlContextImpl::mutex;
    using GlContextImpl::transientContext;

    // Protect from concurrent access
    Lock lock(mutex);

    // Make sure a matching acquireTransientContext() was called
    assert(transientContext);

    // Decrease the reference count
    transientContext->referenceCount--;

    // If this is the last TransientContextLock that is released
    // destroy the state object
    if (transientContext->referenceCount == 0)
    {
        delete transientContext;
        transientContext = NULL;
    }
}